

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O1

void sysbvm_bytecodeInterpreter_ensureTablesAreFilled(void)

{
  if (sysbvm_bytecodeInterpreter_tablesAreFilled == '\0') {
    builtin_memcpy(sysbvm_implicitVariableBytecodeOperandCountTable + 4,
                   "\x02\x02\x03\x04\x01\x01\x02\x01\x01",9);
    sysbvm_implicitVariableBytecodeOperandCountTable[0xe] = '\x02';
    sysbvm_bytecodeInterpreter_tablesAreFilled = '\x01';
  }
  return;
}

Assistant:

void sysbvm_bytecodeInterpreter_ensureTablesAreFilled(void)
{
    if(sysbvm_bytecodeInterpreter_tablesAreFilled)
        return;

    sysbvm_implicitVariableBytecodeOperandCountTable[SYSBVM_OPCODE_CALL >> 4] = 2;
    sysbvm_implicitVariableBytecodeOperandCountTable[SYSBVM_OPCODE_UNCHECKED_CALL >> 4] = 2;
    sysbvm_implicitVariableBytecodeOperandCountTable[SYSBVM_OPCODE_SEND >> 4] = 3;
    sysbvm_implicitVariableBytecodeOperandCountTable[SYSBVM_OPCODE_SEND_WITH_LOOKUP >> 4] = 4;

    sysbvm_implicitVariableBytecodeOperandCountTable[SYSBVM_OPCODE_MAKE_ARRAY_WITH_ELEMENTS >> 4] = 1;
    sysbvm_implicitVariableBytecodeOperandCountTable[SYSBVM_OPCODE_MAKE_BYTE_ARRAY_WITH_ELEMENTS >> 4] = 1;
    sysbvm_implicitVariableBytecodeOperandCountTable[SYSBVM_OPCODE_MAKE_CLOSURE_WITH_CAPTURES >> 4] = 2;
    sysbvm_implicitVariableBytecodeOperandCountTable[SYSBVM_OPCODE_MAKE_DICTIONARY_WITH_ELEMENTS >> 4] = 1;
    sysbvm_implicitVariableBytecodeOperandCountTable[SYSBVM_OPCODE_MAKE_TUPLE_WITH_ELEMENTS >> 4] = 1;

    sysbvm_implicitVariableBytecodeOperandCountTable[SYSBVM_OPCODE_CASE_JUMP >> 4] = 2;

    sysbvm_bytecodeInterpreter_tablesAreFilled = true;
}